

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

PlayerStrategy * __thiscall PlayerStrategy::operator=(PlayerStrategy *this,PlayerStrategy *rhs)

{
  string *__return_storage_ptr__;
  string *psVar1;
  
  this->exchangingCardType = rhs->exchangingCardType;
  this->armiesToPlace = rhs->armiesToPlace;
  this->player = rhs->player;
  this->from = rhs->from;
  this->to = rhs->to;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  psVar1 = getStrategyName_abi_cxx11_(__return_storage_ptr__,rhs);
  operator_delete(__return_storage_ptr__,0x20);
  _Unwind_Resume(psVar1);
}

Assistant:

PlayerStrategy& PlayerStrategy::operator=(const PlayerStrategy& rhs) {
    this->exchangingCardType = rhs.exchangingCardType;
    this->armiesToPlace = rhs.armiesToPlace;
    this->player = rhs.player;
    this->from = rhs.from;
    this->to = rhs.to;
    this->strategyName = new std::string(rhs.getStrategyName());
}